

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  FILE *__stream;
  undefined8 uVar1;
  stringstream stream;
  FILE *xmlout;
  string local_1d0 [48];
  stringstream local_1a0 [40];
  stringstream *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffec0;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  
  __stream = (FILE *)OpenFileForWriting(in_stack_fffffffffffffec0);
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintXmlTestsList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  StringStreamToString(in_stack_fffffffffffffe88);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string(local_1d0);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestSuite*>& test_suites) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_suites);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}